

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O2

char * SHA512_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA512_CTX context;
  SHA512_CTX local_e8;
  
  local_e8.h[0] = 0x6a09e667f3bcc908;
  local_e8.h[1] = 0xbb67ae8584caa73b;
  local_e8.h[2] = 0x3c6ef372fe94f82b;
  local_e8.h[3] = 0xa54ff53a5f1d36f1;
  local_e8.h[4] = 0x510e527fade682d1;
  local_e8.h[5] = 0x9b05688c2b3e6c1f;
  local_e8.h[6] = 0x1f83d9abfb41bd6b;
  local_e8.h[7] = 0x5be0cd19137e2179;
  local_e8.u.d[6] = 0;
  local_e8.u.d[7] = 0;
  local_e8.Nl = 0;
  local_e8.Nh = 0;
  local_e8.u.d[0] = 0;
  local_e8.u.d[1] = 0;
  local_e8.u.d[2] = 0;
  local_e8.u.d[3] = 0;
  local_e8.u.d[4] = 0;
  local_e8.u.d[5] = 0;
  local_e8.u.d[8] = 0;
  local_e8.u.d[9] = 0;
  local_e8.u.d[10] = 0;
  local_e8.u.d[0xb] = 0;
  local_e8.u.d[0xc] = 0;
  local_e8.u.d[0xd] = 0;
  local_e8.u.d[0xe] = 0;
  local_e8.u.d[0xf] = 0;
  SHA512_Update(&local_e8,data,len);
  pcVar1 = SHA512_End((SHA512_CTX *)&local_e8,digest);
  return pcVar1;
}

Assistant:

char* SHA512_Data(const sha2_byte* data, size_t len, char digest[SHA512_DIGEST_STRING_LENGTH]) {
	SHA512_CTX	context;

	SHA512_Init(&context);
	SHA512_Update(&context, data, len);
	return SHA512_End(&context, digest);
}